

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::AttributeRecordSet::ClearAttributeRecords(AttributeRecordSet *this)

{
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vAttrRec);
  this->m_ui16NumAttrRecs = 0;
  return;
}

Assistant:

void AttributeRecordSet::ClearAttributeRecords()
{
    m_vAttrRec.clear();
    m_ui16NumAttrRecs = 0;
}